

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::SimpleDateFormat::matchString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,UnicodeString *monthPattern,Calendar *cal)

{
  UCalendarDateFields UVar1;
  int32_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  UCalendarDateFields field_00;
  int iVar5;
  ulong uVar6;
  UnicodeString *data_00;
  UnicodeString leapMonthName;
  UnicodeString bestMatchName;
  int local_124;
  int32_t local_11c;
  UErrorCode local_118;
  UCalendarDateFields local_114;
  UnicodeString *local_110;
  UObject local_108;
  ulong local_100;
  UnicodeString local_f8;
  UnicodeString local_b8;
  SimpleFormatter local_78;
  
  local_108._vptr_UObject = (_func_int **)&PTR__UnicodeString_00487e70;
  local_b8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_110 = text;
  if ((int)(uint)(field == UCAL_DAY_OF_WEEK) < dataCount) {
    uVar4 = (ulong)(field == UCAL_DAY_OF_WEEK);
    local_100 = (ulong)(uint)dataCount;
    data_00 = data + (field == UCAL_DAY_OF_WEEK);
    uVar6 = 0xffffffff;
    local_11c = 0;
    local_124 = 0;
    local_114 = field;
    do {
      iVar2 = matchStringWithOptionalDot(local_110,start,data_00);
      if (local_124 < iVar2) {
        uVar6 = uVar4 & 0xffffffff;
        local_124 = iVar2;
      }
      if (monthPattern != (UnicodeString *)0x0) {
        local_118 = U_ZERO_ERROR;
        local_f8.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_108._vptr_UObject;
        local_f8.fUnion.fStackFields.fLengthAndFlags = 2;
        SimpleFormatter::SimpleFormatter(&local_78,monthPattern,1,1,&local_118);
        SimpleFormatter::format(&local_78,data_00,&local_f8,&local_118);
        SimpleFormatter::~SimpleFormatter(&local_78);
        if ((local_118 < U_ILLEGAL_ARGUMENT_ERROR) &&
           (iVar2 = matchStringWithOptionalDot(local_110,start,&local_f8), local_124 < iVar2)) {
          local_11c = 1;
          uVar6 = uVar4 & 0xffffffff;
          local_124 = iVar2;
        }
        icu_63::UnicodeString::~UnicodeString(&local_f8);
      }
      UVar1 = local_114;
      uVar4 = uVar4 + 1;
      data_00 = data_00 + 1;
    } while (local_100 != uVar4);
    iVar5 = (int)uVar6;
    if (-1 < iVar5) {
      if ((int)local_114 < 0x17) {
        iVar3 = (*(cal->super_UObject)._vptr_UObject[0x17])(cal);
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"hebrew");
        field_00 = UCAL_MONTH;
        if (iVar5 != 0xd || (UVar1 != UCAL_MONTH || iVar3 != 0)) {
          field_00 = UVar1;
        }
        iVar2 = 6;
        if (iVar5 != 0xd || (UVar1 != UCAL_MONTH || iVar3 != 0)) {
          iVar2 = (uint)(UVar1 == UCAL_YEAR) + iVar5;
        }
        Calendar::set(cal,field_00,iVar2);
        if (monthPattern != (UnicodeString *)0x0) {
          Calendar::set(cal,UCAL_IS_LEAP_MONTH,local_11c);
        }
      }
      iVar2 = local_124 + start;
      goto LAB_002c75b8;
    }
  }
  iVar2 = -start;
LAB_002c75b8:
  icu_63::UnicodeString::~UnicodeString(&local_b8);
  return iVar2;
}

Assistant:

int32_t SimpleDateFormat::matchString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              const UnicodeString* monthPattern,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    if (field == UCAL_DAY_OF_WEEK) i = 1;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;
    int32_t isLeapMonth = 0;

    for (; i < count; ++i) {
        int32_t matchLen = 0;
        if ((matchLen = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatch = i;
            bestMatchLength = matchLen;
        }

        if (monthPattern != NULL) {
            UErrorCode status = U_ZERO_ERROR;
            UnicodeString leapMonthName;
            SimpleFormatter(*monthPattern, 1, 1, status).format(data[i], leapMonthName, status);
            if (U_SUCCESS(status)) {
                if ((matchLen = matchStringWithOptionalDot(text, start, leapMonthName)) > bestMatchLength) {
                    bestMatch = i;
                    bestMatchLength = matchLen;
                    isLeapMonth = 1;
                }
            }
        }
    }

    if (bestMatch >= 0) {
        if (field < UCAL_FIELD_COUNT) {
            // Adjustment for Hebrew Calendar month Adar II
            if (!strcmp(cal.getType(),"hebrew") && field==UCAL_MONTH && bestMatch==13) {
                cal.set(field,6);
            } else {
                if (field == UCAL_YEAR) {
                    bestMatch++; // only get here for cyclic year names, which match 1-based years 1-60
                }
                cal.set(field, bestMatch);
            }
            if (monthPattern != NULL) {
                cal.set(UCAL_IS_LEAP_MONTH, isLeapMonth);
            }
        }

        return start + bestMatchLength;
    }

    return -start;
}